

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

char * ptls_hexdump(char *dst,void *_src,size_t len)

{
  undefined8 local_38;
  size_t i;
  uint8_t *src;
  char *buf;
  size_t len_local;
  void *_src_local;
  char *dst_local;
  
  _src_local = dst;
  for (local_38 = 0; local_38 != len; local_38 = local_38 + 1) {
    _src_local = byte_to_hex((char *)_src_local,*(uint8_t *)((long)_src + local_38));
  }
  *(undefined1 *)_src_local = 0;
  return dst;
}

Assistant:

char *ptls_hexdump(char *dst, const void *_src, size_t len)
{
    char *buf = dst;
    const uint8_t *src = _src;

    for (size_t i = 0; i != len; ++i)
        dst = byte_to_hex(dst, src[i]);
    *dst = '\0';
    return buf;
}